

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

int ipc_helper_send_zero(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_30;
  char *local_28;
  undefined1 local_20 [8];
  uv_buf_t zero_buf;
  int r;
  
  uVar3 = uv_buf_init((char *)0x0,0);
  local_30 = uVar3.base;
  local_20 = (undefined1  [8])local_30;
  local_28 = (char *)uVar3.len;
  zero_buf.base = local_28;
  puVar2 = uv_default_loop();
  zero_buf.len._4_4_ = uv_pipe_init(puVar2,&channel,0);
  if (zero_buf.len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x3b7,"r == 0");
    abort();
  }
  uv_pipe_open(&channel,0);
  iVar1 = uv_is_readable((uv_stream_t *)&channel);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x3bb,"1 == uv_is_readable((uv_stream_t*) &channel)");
    abort();
  }
  iVar1 = uv_is_writable((uv_stream_t *)&channel);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x3bc,"1 == uv_is_writable((uv_stream_t*) &channel)");
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)&channel);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x3bd,"0 == uv_is_closing((uv_handle_t*) &channel)");
    abort();
  }
  zero_buf.len._4_4_ =
       uv_write(&write_req,(uv_stream_t *)&channel,(uv_buf_t *)local_20,1,send_zero_write_cb);
  if (zero_buf.len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x3c5,"r == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  zero_buf.len._4_4_ = uv_run(puVar2,UV_RUN_DEFAULT);
  if (zero_buf.len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x3c8,"r == 0");
    abort();
  }
  if (send_zero_write != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x3ca,"send_zero_write == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x3cc,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

int ipc_helper_send_zero(void) {
  int r;
  uv_buf_t zero_buf;

  zero_buf = uv_buf_init(0, 0);

  r = uv_pipe_init(uv_default_loop(), &channel, 0);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_write(&write_req,
               (uv_stream_t*)&channel,
               &zero_buf,
               1,
               send_zero_write_cb);

  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(send_zero_write == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}